

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_log_mfc(acmod_t *acmod,mfcc_t **cep,int n_frames)

{
  mfcc_t *pmVar1;
  ulong __n;
  size_t sVar2;
  int32 *ptr;
  size_t n;
  size_t i;
  int n_frames_local;
  mfcc_t **cep_local;
  acmod_t *acmod_local;
  
  pmVar1 = *cep;
  __n = (ulong)(n_frames * acmod->fcb->cepsize);
  for (n = 0; n < (__n & 0x3fffffffffffffff); n = n + 1) {
    pmVar1[n] = (mfcc_t)((int)pmVar1[n] >> 0x18 & 0xffU | (int)pmVar1[n] >> 8 & 0xff00U |
                         ((uint)pmVar1[n] & 0xff00) << 8 | (int)pmVar1[n] << 0x18);
  }
  sVar2 = fwrite(*cep,4,__n,(FILE *)acmod->mfcfh);
  if (sVar2 != __n) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                   ,0x1e4,"Failed to write %d values to log file",__n);
  }
  for (n = 0; n < (__n & 0x3fffffffffffffff); n = n + 1) {
    pmVar1[n] = (mfcc_t)((int)pmVar1[n] >> 0x18 & 0xffU | (int)pmVar1[n] >> 8 & 0xff00U |
                         ((uint)pmVar1[n] & 0xff00) << 8 | (int)pmVar1[n] << 0x18);
  }
  return 0;
}

Assistant:

static int
acmod_log_mfc(acmod_t *acmod,
              mfcc_t **cep, int n_frames)
{
    size_t i, n;
    int32 *ptr = (int32 *)cep[0];

    n = n_frames * feat_cepsize(acmod->fcb);
    /* Swap bytes. */
#ifndef WORDS_BIGENDIAN
    for (i = 0; i < (n * sizeof(mfcc_t) / sizeof(int32)); ++i) {
            SWAP_INT32(ptr + i);
    }
#endif
    /* Write features. */
    if (fwrite(cep[0], sizeof(mfcc_t), n, acmod->mfcfh) != n) {
        E_ERROR_SYSTEM("Failed to write %d values to log file", n);
    }

    /* Swap them back. */
#ifndef WORDS_BIGENDIAN
    for (i = 0; i < (n * sizeof(mfcc_t) / sizeof(int32)); ++i) {
        SWAP_INT32(ptr + i);
    }
#endif
    return 0;
}